

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptoperator.cpp
# Opt level: O2

void __thiscall
ScriptOperator_operator_4_Test::ScriptOperator_operator_4_Test(ScriptOperator_operator_4_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0045c330;
  return;
}

Assistant:

TEST(ScriptOperator, operator_4) {
  ScriptOperator script_op(ScriptOperator::OP_12);
  EXPECT_FALSE(script_op < ScriptOperator::OP_PUSHDATA2);
  EXPECT_FALSE(script_op < ScriptOperator::OP_1);
  EXPECT_FALSE(script_op < ScriptOperator::OP_12);
  EXPECT_TRUE(script_op < ScriptOperator::OP_15);
  EXPECT_TRUE(script_op < ScriptOperator::OP_NOP);
  EXPECT_TRUE(script_op.IsPushOperator());
}